

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O0

void __thiscall Nes_Namco::Nes_Namco(Nes_Namco *this)

{
  Nes_Namco *in_RDI;
  Nes_Namco *unaff_retaddr;
  double in_stack_ffffffffffffffe8;
  Nes_Namco *buf;
  
  buf = in_RDI;
  Blip_Synth<3,_15>::Blip_Synth((Blip_Synth<3,_15> *)in_RDI);
  output(unaff_retaddr,(Blip_Buffer *)buf);
  volume(in_RDI,in_stack_ffffffffffffffe8);
  reset(in_RDI);
  return;
}

Assistant:

Nes_Namco::Nes_Namco()
{
	output( NULL );
	volume( 1.0 );
	reset();
}